

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O1

size_t __thiscall
curlpp::internal::CurlHandle::executeReadFunctor
          (CurlHandle *this,char *buffer,size_t size,size_t nitems)

{
  FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
  *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  CallbackExceptionBase *this_00;
  size_t sVar3;
  LogicError local_20;
  
  pFVar1 = (this->mReadFunctor).mImpl._M_ptr;
  if (pFVar1 == (FunctorImpl<unsigned_long,_utilspp::tl::TypeList<char_*,_utilspp::tl::TypeList<unsigned_long,_utilspp::tl::TypeList<unsigned_long,_utilspp::NullType>_>_>_>
                 *)0x0) {
    this_00 = (CallbackExceptionBase *)operator_new(0x20);
    LogicError::LogicError(&local_20,"Null write functor");
    CallbackExceptionBase::CallbackExceptionBase(this_00);
    *(undefined ***)&this_00->super_RuntimeError = &PTR__CallbackException_00133c90;
    std::logic_error::logic_error((logic_error *)(this_00 + 1),&local_20.super_logic_error);
    *(undefined ***)&this_00[1].super_RuntimeError = &PTR__LogicError_00133948;
    if (this->mException != (CallbackExceptionBase *)0x0) {
      (**(code **)(*(long *)&this->mException->super_RuntimeError + 8))();
    }
    this->mException = this_00;
    LogicError::~LogicError(&local_20);
    sVar3 = 0x2a;
  }
  else {
    iVar2 = (**pFVar1->_vptr_FunctorImpl)();
    sVar3 = CONCAT44(extraout_var,iVar2);
  }
  return sVar3;
}

Assistant:

size_t 
CurlHandle::executeReadFunctor(char * buffer, size_t size, size_t nitems)
{
	if(!mReadFunctor)
	{
		setException(new CallbackException<curlpp::LogicError>(curlpp::LogicError("Null write functor")));
		return CURLE_ABORTED_BY_CALLBACK;
	}

	try
	{
		return mReadFunctor(buffer, size, nitems);
	}

	catch(curlpp::CallbackExceptionBase * e)
	{
		setException(e);
	}

	catch(...)
	{
		setException(new CallbackException<curlpp::UnknowException>(curlpp::UnknowException()));
	}

	return CURLE_ABORTED_BY_CALLBACK;
}